

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

void asm_min_max(ASMState *as,IRIns *ir,int cc)

{
  ushort uVar1;
  uint uVar2;
  Reg dest;
  Reg r2;
  uint uVar3;
  IRRef lref;
  
  dest = ra_dest(as,ir,0xffef);
  uVar1 = (ir->field_0).op2;
  uVar3 = (uint)uVar1;
  lref = (uint)(ir->field_0).op1;
  if (-1 < (short)uVar1) {
    lref = (IRRef)uVar1;
    uVar3 = (uint)(ir->field_0).op1;
  }
  r2 = ra_alloc1(as,uVar3,~(1 << (dest & 0x1f)) & 0xffef);
  uVar3._0_2_ = *(IROpT *)((long)ir + 4);
  uVar3._2_2_ = *(IRRef1 *)((long)ir + 6);
  emit_rr(as,cc * 0x1000000 + XO_CMOV,
          -(uint)((0x604208U >> (uVar3 & 0x1f) & 1) != 0) & 0x80200 | dest,r2);
  uVar2._0_2_ = *(IROpT *)((long)ir + 4);
  uVar2._2_2_ = *(IRRef1 *)((long)ir + 6);
  emit_rr(as,XO_CMP,-(uint)((0x604208U >> (uVar2 & 0x1f) & 1) != 0) & 0x80200 | dest,r2);
  ra_left(as,dest,lref);
  return;
}

Assistant:

static void asm_min_max(ASMState *as, IRIns *ir, int cc)
{
  Reg right, dest = ra_dest(as, ir, RSET_GPR);
  IRRef lref = ir->op1, rref = ir->op2;
  if (irref_isk(rref)) { lref = rref; rref = ir->op1; }
  right = ra_alloc1(as, rref, rset_exclude(RSET_GPR, dest));
  emit_rr(as, XO_CMOV + (cc<<24), REX_64IR(ir, dest), right);
  emit_rr(as, XO_CMP, REX_64IR(ir, dest), right);
  ra_left(as, dest, lref);
}